

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O0

void OpenMD::registerIntegrators(void)

{
  IntegratorCreator *creator;
  IntegratorFactory *this;
  allocator<char> *__a;
  char *__s;
  IntegratorFactory *this_00;
  string *in_stack_fffffffffffffba8;
  IntegratorBuilder<OpenMD::LangevinDynamics> *in_stack_fffffffffffffbb0;
  allocator<char> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  IntegratorCreator *in_stack_fffffffffffffc28;
  IntegratorFactory *in_stack_fffffffffffffc30;
  allocator<char> local_2b1;
  string local_2b0 [38];
  undefined1 local_28a;
  allocator<char> local_289;
  string local_288 [38];
  undefined1 local_262;
  undefined1 local_261 [39];
  undefined1 local_23a;
  allocator<char> local_239;
  string local_238 [38];
  undefined1 local_212;
  allocator<char> local_211;
  string local_210 [38];
  undefined1 local_1ea;
  allocator<char> local_1e9;
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator<char> local_1c1;
  string local_1c0 [38];
  undefined1 local_19a;
  allocator<char> local_199;
  string local_198 [38];
  undefined1 local_172;
  allocator<char> local_171;
  string local_170 [38];
  undefined1 local_14a;
  allocator<char> local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator<char> local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator<char> local_81;
  string local_80 [38];
  undefined1 local_5a;
  allocator<char> local_59;
  string local_58 [35];
  undefined1 local_35;
  allocator<char> local_21;
  string local_20 [32];
  
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_35 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NVE>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NVE> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_35 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator(&local_21);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_5a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NVT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NVT> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_5a = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPTi>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTi> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
  ;
  local_82 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPTf>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTf> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
  ;
  local_aa = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPTxyz>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPTxyz> *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8);
  local_d2 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPAT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPAT> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
  ;
  local_fa = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_122 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPA>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPA> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_122 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_14a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPrT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPrT> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
  ;
  local_14a = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_172 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NPrT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NPrT> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
  ;
  local_172 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_19a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NgammaT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NgammaT> *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8);
  local_19a = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_1c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::NgammaT>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::NgammaT> *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8);
  local_1c2 = 0;
  IntegratorFactory::registerIntegrator(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  creator = (IntegratorCreator *)IntegratorFactory::getInstance();
  this = (IntegratorFactory *)operator_new(0x28);
  local_1ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_1ea = 0;
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_212 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_212 = 0;
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_23a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_23a = 0;
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  __a = (allocator<char> *)IntegratorFactory::getInstance();
  __s = (char *)operator_new(0x28);
  local_262 = 1;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_262 = 0;
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string((string *)(local_261 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_261);
  IntegratorFactory::getInstance();
  operator_new(0x28);
  local_28a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  IntegratorBuilder<OpenMD::LangevinDynamics>::IntegratorBuilder
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_28a = 0;
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  this_00 = IntegratorFactory::getInstance();
  operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  IntegratorBuilder<OpenMD::LangevinPiston>::IntegratorBuilder
            ((IntegratorBuilder<OpenMD::LangevinPiston> *)this_00,in_stack_fffffffffffffba8);
  IntegratorFactory::registerIntegrator(this,creator);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  return;
}

Assistant:

void registerIntegrators() {
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVE>("NVE"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVT>("NVT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTi>("NPTI"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTf>("NPTF"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTxyz>("NPTXYZ"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPAT>("NPAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPA>("NPA"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPRT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGAMMAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINDYNAMICS"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("SMIPD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinPiston>("LANGEVINPISTON"));
  }